

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sight.cpp
# Opt level: O0

bool __thiscall SightCheck::P_SightTraverseIntercepts(SightCheck *this)

{
  F3DFloor *pFVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  intercept_t *piVar5;
  xfloor *this_00;
  F3DFloor **ppFVar6;
  uint uVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double ff_top;
  double ff_bottom;
  F3DFloor *rover;
  iterator __end2;
  iterator __begin2;
  TDeletingArray<F3DFloor_*,_F3DFloor_*> *__range2;
  double bottomz;
  double topz;
  divline_t dl;
  intercept_t *piStack_38;
  uint scanpos;
  intercept_t *in;
  intercept_t *scan;
  double dist;
  uint count;
  SightCheck *this_local;
  
  dist._4_4_ = TArray<intercept_t,_intercept_t>::Size(&intercepts);
  for (dl.dy._4_4_ = 0; uVar7 = dl.dy._4_4_,
      uVar3 = TArray<intercept_t,_intercept_t>::Size(&intercepts), uVar7 < uVar3;
      dl.dy._4_4_ = dl.dy._4_4_ + 1) {
    piVar5 = TArray<intercept_t,_intercept_t>::operator[](&intercepts,(ulong)dl.dy._4_4_);
    P_MakeDivline((line_t *)(piVar5->d).thing,(divline_t *)&topz);
    dVar8 = P_InterceptVector(&this->Trace,(divline_t *)&topz);
    piVar5->frac = dVar8;
    if (piVar5->frac < this->Startfrac) {
      piVar5->frac = 2147483647.0;
      dist._4_4_ = dist._4_4_ - 1;
    }
  }
  piStack_38 = (intercept_t *)0x0;
  while (uVar7 = dist._4_4_ - 1, dist._4_4_ != 0) {
    scan = (intercept_t *)0x41dfffffffc00000;
    for (dl.dy._4_4_ = 0; uVar3 = dl.dy._4_4_,
        uVar4 = TArray<intercept_t,_intercept_t>::Size(&intercepts), uVar3 < uVar4;
        dl.dy._4_4_ = dl.dy._4_4_ + 1) {
      piVar5 = TArray<intercept_t,_intercept_t>::operator[](&intercepts,(ulong)dl.dy._4_4_);
      if (piVar5->frac < (double)scan) {
        scan = (intercept_t *)piVar5->frac;
        piStack_38 = piVar5;
      }
    }
    dist._4_4_ = uVar7;
    if (piStack_38 != (intercept_t *)0x0) {
      bVar2 = PTR_SightTraverse(this,piStack_38);
      if (!bVar2) {
        return false;
      }
      piStack_38->frac = 2147483647.0;
    }
  }
  if ((this->lastsector == (sector_t_conflict *)this->seeingthing->Sector) &&
     (uVar7 = TArray<F3DFloor_*,_F3DFloor_*>::Size
                        ((TArray<F3DFloor_*,_F3DFloor_*> *)&this->lastsector->e->XFloor), uVar7 != 0
     )) {
    dVar8 = this->topslope + (this->sightstart).Z;
    dVar9 = this->bottomslope + (this->sightstart).Z;
    this_00 = &this->lastsector->e->XFloor;
    __end2 = TArray<F3DFloor_*,_F3DFloor_*>::begin((TArray<F3DFloor_*,_F3DFloor_*> *)this_00);
    rover = (F3DFloor *)
            TArray<F3DFloor_*,_F3DFloor_*>::end((TArray<F3DFloor_*,_F3DFloor_*> *)this_00);
    while (bVar2 = TIterator<F3DFloor_*>::operator!=(&__end2,(TIterator<F3DFloor_*> *)&rover), bVar2
          ) {
      ppFVar6 = TIterator<F3DFloor_*>::operator*(&__end2);
      pFVar1 = *ppFVar6;
      if ((((pFVar1->flags & 2) != this->myseethrough) && ((pFVar1->flags & 1) != 0)) &&
         (((this->Flags & 8U) == 0 || ((pFVar1->flags & 2) != 0)))) {
        dVar10 = secplane_t::ZatPoint((pFVar1->bottom).plane,this->seeingthing);
        dVar11 = secplane_t::ZatPoint((pFVar1->top).plane,this->seeingthing);
        if ((((this->Lastztop <= dVar10) && (dVar10 < dVar8)) && (this->Lastzbottom <= dVar10)) &&
           (dVar10 < dVar9)) {
          return false;
        }
        if (((dVar11 <= this->Lastzbottom) && (dVar9 < dVar11)) &&
           ((dVar11 <= this->Lastztop && (dVar8 < dVar11)))) {
          return false;
        }
      }
      TIterator<F3DFloor_*>::operator++(&__end2);
    }
  }
  return true;
}

Assistant:

bool SightCheck::P_SightTraverseIntercepts ()
{
	unsigned count;
	double dist;
	intercept_t *scan, *in;
	unsigned scanpos;
	divline_t dl;

	count = intercepts.Size ();
//
// calculate intercept distance
//
	for (scanpos = 0; scanpos < intercepts.Size (); scanpos++)
	{
		scan = &intercepts[scanpos];
		P_MakeDivline (scan->d.line, &dl);
		scan->frac = P_InterceptVector (&Trace, &dl);
		if (scan->frac < Startfrac)
		{
			scan->frac = INT_MAX;
			count--;
		}
	}

//
// go through in order
// proper order is needed to handle 3D floors and portals.
//
	in = NULL;

	while (count--)
	{
		dist = INT_MAX;
		for (scanpos = 0; scanpos < intercepts.Size (); scanpos++)
		{
			scan = &intercepts[scanpos];
			if (scan->frac < dist)
			{
				dist = scan->frac;
				in = scan;
			}
		}

		if (in != NULL)
		{
			if (!PTR_SightTraverse (in))
				return false;					// don't bother going farther
			in->frac = INT_MAX;
		}
	}

	if (lastsector == seeingthing->Sector && lastsector->e->XFloor.ffloors.Size())
	{
		// we must do one last check whether the trace has crossed a 3D floor in the last sector

		double topz = topslope + sightstart.Z;
		double bottomz = bottomslope + sightstart.Z;

		for (auto rover : lastsector->e->XFloor.ffloors)
		{
			if ((rover->flags & FF_SOLID) == myseethrough || !(rover->flags & FF_EXISTS)) continue;
			if ((Flags & SF_IGNOREWATERBOUNDARY) && (rover->flags & FF_SOLID) == 0) continue;

			double ff_bottom = rover->bottom.plane->ZatPoint(seeingthing);
			double ff_top = rover->top.plane->ZatPoint(seeingthing);

			if (Lastztop <= ff_bottom && topz > ff_bottom && Lastzbottom <= ff_bottom && bottomz > ff_bottom) return false;
			if (Lastzbottom >= ff_top && bottomz < ff_top && Lastztop >= ff_top && topz < ff_top) return false;
		}
	}
	return true;			// everything was traversed
}